

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

void lua_insert(lua_State *L,int idx)

{
  TValue *pTVar1;
  int in_ESI;
  lua_State *in_RDI;
  TValue *p;
  TValue *q;
  TValue *local_78;
  
  pTVar1 = index2adr_stack(in_RDI,in_ESI);
  for (local_78 = in_RDI->top; pTVar1 < local_78; local_78 = local_78 + -1) {
    *local_78 = local_78[-1];
  }
  *pTVar1 = *in_RDI->top;
  return;
}

Assistant:

LUA_API void lua_insert(lua_State *L, int idx)
{
  TValue *q, *p = index2adr_stack(L, idx);
  for (q = L->top; q > p; q--) copyTV(L, q, q-1);
  copyTV(L, p, L->top);
}